

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  ulong uVar14;
  undefined4 uVar15;
  ulong uVar16;
  size_t *psVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  size_t sVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar34;
  undefined1 auVar33 [16];
  float fVar37;
  float fVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar39;
  float fVar41;
  float fVar42;
  undefined1 auVar40 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  float fVar47;
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  size_t local_1b8;
  size_t local_1b0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  anon_class_16_2_07cfa4d6 local_130;
  ulong local_120;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_198._8_4_ = 0x7f800000;
  local_198._0_8_ = 0x7f8000007f800000;
  local_198._12_4_ = 0x7f800000;
  auVar45 = ZEXT1664(local_198);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = local_198;
  local_188._8_4_ = 0xff800000;
  local_188._0_8_ = 0xff800000ff800000;
  local_188._12_4_ = 0xff800000;
  auVar46 = ZEXT1664(local_188);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = local_188;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = local_198;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = local_188;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar25._8_8_ = 0;
  auVar25._0_4_ =
       (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar25._4_4_ =
       (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar27._8_8_ = 0;
  auVar27._0_4_ = time_range->lower;
  auVar27._4_4_ = time_range->upper;
  auVar6 = vcmpps_avx(auVar25,auVar27,1);
  auVar44 = vinsertps_avx(auVar27,auVar25,0x50);
  auVar25 = vinsertps_avx(auVar25,auVar27,0x50);
  auVar6 = vblendvps_avx(auVar25,auVar44,auVar6);
  auVar44 = vmovshdup_avx(auVar6);
  fVar47 = auVar44._0_4_;
  if (auVar6._0_4_ <= fVar47) {
    uVar14 = r->_begin;
    local_1b0 = 0;
    auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar49 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar50 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    local_1b8 = k;
    while( true ) {
      auVar25 = auVar46._0_16_;
      auVar44 = auVar45._0_16_;
      if (r->_end <= uVar14) break;
      BVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar26._8_8_ = 0;
      auVar26._0_4_ = BVar2.lower;
      auVar26._4_4_ = BVar2.upper;
      auVar27 = vmovshdup_avx(auVar26);
      fVar23 = BVar2.lower;
      fVar34 = auVar27._0_4_ - fVar23;
      uVar3 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar14);
      pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      if ((ulong)(uVar3 + 3) < (pBVar4->super_RawBufferView).num) {
        fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.fnumTimeSegments;
        auVar26 = ZEXT416((uint)(fVar1 * ((fVar47 - fVar23) / fVar34) * 0.99999976));
        auVar26 = vroundss_avx(auVar26,auVar26,10);
        auVar36 = vminss_avx(auVar26,ZEXT416((uint)fVar1));
        fVar31 = auVar6._0_4_ - fVar23;
        auVar26 = ZEXT416((uint)(fVar1 * (fVar31 / fVar34) * 1.0000002));
        auVar26 = vroundss_avx(auVar26,auVar26,9);
        auVar26 = vmaxss_avx(auVar48._0_16_,auVar26);
        psVar17 = &pBVar4[(int)auVar26._0_4_].super_RawBufferView.stride;
        uVar16 = (long)(int)auVar26._0_4_ - 1;
LAB_00be1c32:
        uVar16 = uVar16 + 1;
        if ((ulong)(long)(int)auVar36._0_4_ < uVar16) {
          local_130.primID = &local_120;
          fVar24 = auVar27._0_4_ - fVar23;
          fVar31 = fVar31 / fVar24;
          fVar24 = (fVar47 - fVar23) / fVar24;
          fVar34 = fVar1 * fVar31;
          fVar23 = fVar1 * fVar24;
          auVar36 = vroundss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),9);
          auVar40 = vroundss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),10);
          auVar27 = vmaxss_avx(auVar36,auVar48._0_16_);
          auVar26 = vminss_avx(auVar40,ZEXT416((uint)fVar1));
          iVar13 = (int)auVar27._0_4_;
          fVar32 = auVar26._0_4_;
          iVar12 = (int)auVar36._0_4_;
          iVar19 = -1;
          if (-1 < iVar12) {
            iVar19 = iVar12;
          }
          iVar9 = (int)fVar1 + 1;
          if ((int)auVar40._0_4_ < (int)fVar1 + 1) {
            iVar9 = (int)auVar40._0_4_;
          }
          local_130.this = this;
          local_120 = uVar14;
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_130,(long)iVar13);
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_130,(long)(int)fVar32);
          fVar34 = fVar34 - auVar27._0_4_;
          if (iVar9 - iVar19 == 1) {
            auVar27 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
            auVar26 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar36._0_4_ =
                 auVar26._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar27._0_4_ * blower0.lower.field_0.m128[0];
            auVar36._4_4_ =
                 auVar26._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar27._4_4_ * blower0.lower.field_0.m128[1];
            auVar36._8_4_ =
                 auVar26._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar27._8_4_ * blower0.lower.field_0.m128[2];
            auVar36._12_4_ =
                 auVar26._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar27._12_4_ * blower0.lower.field_0.m128[3];
            auVar40._0_4_ =
                 auVar26._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar27._0_4_ * blower0.upper.field_0.m128[0];
            auVar40._4_4_ =
                 auVar26._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar27._4_4_ * blower0.upper.field_0.m128[1];
            auVar40._8_4_ =
                 auVar26._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar27._8_4_ * blower0.upper.field_0.m128[2];
            auVar40._12_4_ =
                 auVar26._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar27._12_4_ * blower0.upper.field_0.m128[3];
            auVar27 = vmaxss_avx(ZEXT416((uint)(fVar32 - fVar23)),ZEXT816(0) << 0x40);
            auVar26 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar29._0_4_ =
                 auVar27._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar26._0_4_ * blower0.lower.field_0.m128[0];
            auVar29._4_4_ =
                 auVar27._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar26._4_4_ * blower0.lower.field_0.m128[1];
            auVar29._8_4_ =
                 auVar27._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar26._8_4_ * blower0.lower.field_0.m128[2];
            auVar29._12_4_ =
                 auVar27._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar26._12_4_ * blower0.lower.field_0.m128[3];
            auVar33._0_4_ =
                 auVar27._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar26._0_4_ * blower0.upper.field_0.m128[0];
            auVar33._4_4_ =
                 auVar27._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar26._4_4_ * blower0.upper.field_0.m128[1];
            auVar33._8_4_ =
                 auVar27._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar26._8_4_ * blower0.upper.field_0.m128[2];
            auVar33._12_4_ =
                 auVar27._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar26._12_4_ * blower0.upper.field_0.m128[3];
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&blower1,&local_130,(long)(iVar13 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&bupper0,&local_130,(long)((int)fVar32 + -1));
            auVar27 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
            auVar26 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar36._0_4_ =
                 auVar26._0_4_ * blower1.lower.field_0.m128[0] +
                 auVar27._0_4_ * blower0.lower.field_0.m128[0];
            auVar36._4_4_ =
                 auVar26._4_4_ * blower1.lower.field_0.m128[1] +
                 auVar27._4_4_ * blower0.lower.field_0.m128[1];
            auVar36._8_4_ =
                 auVar26._8_4_ * blower1.lower.field_0.m128[2] +
                 auVar27._8_4_ * blower0.lower.field_0.m128[2];
            auVar36._12_4_ =
                 auVar26._12_4_ * blower1.lower.field_0.m128[3] +
                 auVar27._12_4_ * blower0.lower.field_0.m128[3];
            auVar40._0_4_ =
                 auVar26._0_4_ * blower1.upper.field_0.m128[0] +
                 auVar27._0_4_ * blower0.upper.field_0.m128[0];
            auVar40._4_4_ =
                 auVar26._4_4_ * blower1.upper.field_0.m128[1] +
                 auVar27._4_4_ * blower0.upper.field_0.m128[1];
            auVar40._8_4_ =
                 auVar26._8_4_ * blower1.upper.field_0.m128[2] +
                 auVar27._8_4_ * blower0.upper.field_0.m128[2];
            auVar40._12_4_ =
                 auVar26._12_4_ * blower1.upper.field_0.m128[3] +
                 auVar27._12_4_ * blower0.upper.field_0.m128[3];
            auVar27 = vmaxss_avx(ZEXT416((uint)(fVar32 - fVar23)),ZEXT816(0) << 0x40);
            auVar26 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar29._0_4_ =
                 auVar26._0_4_ * bupper0.lower.field_0.m128[0] +
                 auVar27._0_4_ * bupper1.lower.field_0.m128[0];
            auVar29._4_4_ =
                 auVar26._4_4_ * bupper0.lower.field_0.m128[1] +
                 auVar27._4_4_ * bupper1.lower.field_0.m128[1];
            auVar29._8_4_ =
                 auVar26._8_4_ * bupper0.lower.field_0.m128[2] +
                 auVar27._8_4_ * bupper1.lower.field_0.m128[2];
            auVar29._12_4_ =
                 auVar26._12_4_ * bupper0.lower.field_0.m128[3] +
                 auVar27._12_4_ * bupper1.lower.field_0.m128[3];
            auVar33._0_4_ =
                 auVar26._0_4_ * bupper0.upper.field_0.m128[0] +
                 auVar27._0_4_ * bupper1.upper.field_0.m128[0];
            auVar33._4_4_ =
                 auVar26._4_4_ * bupper0.upper.field_0.m128[1] +
                 auVar27._4_4_ * bupper1.upper.field_0.m128[1];
            auVar33._8_4_ =
                 auVar26._8_4_ * bupper0.upper.field_0.m128[2] +
                 auVar27._8_4_ * bupper1.upper.field_0.m128[2];
            auVar33._12_4_ =
                 auVar26._12_4_ * bupper0.upper.field_0.m128[3] +
                 auVar27._12_4_ * bupper1.upper.field_0.m128[3];
            if (iVar12 < 0) {
              iVar12 = -1;
            }
            sVar21 = (size_t)iVar12;
            while (sVar21 = sVar21 + 1, (long)sVar21 < (long)iVar9) {
              auVar28._0_4_ = ((float)(int)sVar21 / fVar1 - fVar31) / (fVar24 - fVar31);
              auVar28._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar27 = vshufps_avx(auVar28,auVar28,0);
              local_1c8 = auVar29._0_4_;
              fStack_1c4 = auVar29._4_4_;
              fStack_1c0 = auVar29._8_4_;
              fStack_1bc = auVar29._12_4_;
              auVar26 = vshufps_avx(ZEXT416((uint)(1.0 - auVar28._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar28._0_4_)),0);
              fVar37 = auVar36._4_4_;
              fVar38 = auVar36._8_4_;
              fVar39 = auVar36._12_4_;
              fVar34 = auVar33._4_4_;
              fVar23 = auVar33._8_4_;
              fVar32 = auVar33._12_4_;
              fVar41 = auVar40._4_4_;
              fVar42 = auVar40._8_4_;
              fVar43 = auVar40._12_4_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_130,sVar21);
              auVar11._4_4_ = auVar27._4_4_ * fStack_1c4 + fVar37 * auVar26._4_4_;
              auVar11._0_4_ = auVar27._0_4_ * local_1c8 + auVar36._0_4_ * auVar26._0_4_;
              auVar11._8_4_ = auVar27._8_4_ * fStack_1c0 + fVar38 * auVar26._8_4_;
              auVar11._12_4_ = auVar27._12_4_ * fStack_1bc + fVar39 * auVar26._12_4_;
              auVar29 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar11);
              auVar10._4_4_ = fVar34 * auVar27._4_4_ + fVar41 * auVar26._4_4_;
              auVar10._0_4_ = auVar33._0_4_ * auVar27._0_4_ + auVar40._0_4_ * auVar26._0_4_;
              auVar10._8_4_ = fVar23 * auVar27._8_4_ + fVar42 * auVar26._8_4_;
              auVar10._12_4_ = fVar32 * auVar27._12_4_ + fVar43 * auVar26._12_4_;
              auVar27 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar10);
              auVar26 = vminps_avx(auVar29,ZEXT816(0) << 0x40);
              auVar27 = vmaxps_avx(auVar27,ZEXT816(0) << 0x40);
              auVar36._0_4_ = auVar36._0_4_ + auVar26._0_4_;
              auVar36._4_4_ = fVar37 + auVar26._4_4_;
              auVar36._8_4_ = fVar38 + auVar26._8_4_;
              auVar36._12_4_ = fVar39 + auVar26._12_4_;
              auVar29._0_4_ = local_1c8 + auVar26._0_4_;
              auVar29._4_4_ = fStack_1c4 + auVar26._4_4_;
              auVar29._8_4_ = fStack_1c0 + auVar26._8_4_;
              auVar29._12_4_ = fStack_1bc + auVar26._12_4_;
              auVar40._0_4_ = auVar40._0_4_ + auVar27._0_4_;
              auVar40._4_4_ = fVar41 + auVar27._4_4_;
              auVar40._8_4_ = fVar42 + auVar27._8_4_;
              auVar40._12_4_ = fVar43 + auVar27._12_4_;
              auVar33._0_4_ = auVar33._0_4_ + auVar27._0_4_;
              auVar33._4_4_ = fVar34 + auVar27._4_4_;
              auVar33._8_4_ = fVar23 + auVar27._8_4_;
              auVar33._12_4_ = fVar32 + auVar27._12_4_;
            }
          }
          auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar27 = vcmpps_avx(auVar36,auVar40,2);
          uVar15 = vmovmskps_avx(auVar27);
          auVar45 = ZEXT1664(auVar44);
          auVar46 = ZEXT1664(auVar25);
          auVar49 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar50 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          if ((~(byte)uVar15 & 7) == 0) {
            auVar27 = vcmpps_avx(auVar29,auVar33,2);
            uVar15 = vmovmskps_avx(auVar27);
            if ((~(byte)uVar15 & 7) == 0) {
              auVar27 = vminps_avx(auVar36,auVar29);
              aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar27,ZEXT416(geomID),0x30);
              auVar27 = vmaxps_avx(auVar40,auVar33);
              aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar27,ZEXT416((uint)uVar14),0x30);
              auVar30._0_4_ = aVar7.x + aVar8.x;
              auVar30._4_4_ = aVar7.y + aVar8.y;
              auVar30._8_4_ = aVar7.z + aVar8.z;
              auVar30._12_4_ = aVar7.field_3.w + aVar8.field_3.w;
              local_198 = vminps_avx(local_198,(undefined1  [16])aVar7);
              local_188 = vmaxps_avx(local_188,(undefined1  [16])aVar8);
              auVar44 = vminps_avx(auVar44,auVar30);
              auVar45 = ZEXT1664(auVar44);
              auVar44 = vmaxps_avx(auVar25,auVar30);
              auVar46 = ZEXT1664(auVar44);
              local_1b0 = local_1b0 + 1;
              prims[local_1b8].lower.field_0.field_1 = aVar7;
              prims[local_1b8].upper.field_0.field_1 = aVar8;
              local_1b8 = local_1b8 + 1;
            }
          }
        }
        else {
          pcVar5 = ((RawBufferView *)(psVar17 + -2))->ptr_ofs;
          sVar21 = *psVar17;
          lVar22 = sVar21 * (uVar3 + 1);
          lVar20 = sVar21 * (uVar3 + 2);
          lVar18 = sVar21 * (uVar3 + 3);
          auVar26 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + sVar21 * uVar3 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar5 + lVar22 + 0xc)),0x10);
          auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(pcVar5 + lVar20 + 0xc)),0x20);
          auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(pcVar5 + lVar18 + 0xc)),0x30);
          auVar26 = vandps_avx(auVar49._0_16_,auVar26);
          auVar40 = auVar50._0_16_;
          auVar26 = vcmpps_avx(auVar26,auVar40,5);
          if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar26[0xf]) {
            auVar35._8_4_ = 0xddccb9a2;
            auVar35._0_8_ = 0xddccb9a2ddccb9a2;
            auVar35._12_4_ = 0xddccb9a2;
            auVar26 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar21 * uVar3),auVar35,6);
            auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar21 * uVar3),auVar40,1);
            auVar26 = vandps_avx(auVar26,auVar29);
            uVar15 = vmovmskps_avx(auVar26);
            if ((~(byte)uVar15 & 7) == 0) {
              auVar26 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar22),auVar35,6);
              auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar22),auVar40,1);
              auVar26 = vandps_avx(auVar26,auVar29);
              uVar15 = vmovmskps_avx(auVar26);
              if ((~(byte)uVar15 & 7) == 0) {
                auVar26 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar20),auVar35,6);
                auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar20),auVar40,1);
                auVar26 = vandps_avx(auVar26,auVar29);
                uVar15 = vmovmskps_avx(auVar26);
                if ((~(byte)uVar15 & 7) == 0) goto code_r0x00be1d10;
              }
            }
          }
        }
      }
LAB_00be1d3f:
      uVar14 = uVar14 + 1;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_198._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_188._8_8_;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
     field_0.m128 = auVar44;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
     field_0.m128 = auVar25;
    __return_storage_ptr__->end = local_1b0;
  }
  return __return_storage_ptr__;
code_r0x00be1d10:
  psVar17 = psVar17 + 7;
  auVar26 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar18),auVar35,6);
  auVar40 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar18),auVar40,1);
  auVar26 = vandps_avx(auVar26,auVar40);
  uVar15 = vmovmskps_avx(auVar26);
  if ((~(byte)uVar15 & 7) != 0) goto LAB_00be1d3f;
  goto LAB_00be1c32;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }